

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# di.hpp
# Opt level: O0

void __thiscall
boost::ext::di::v1_3_0::core::
injector<must_be_injected,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::policies::constructible_impl<false,boost::ext::di::v1_3_0::policies::is_injected<boost::ext::di::v1_3_0::_>>>>>
::operator()(injector<must_be_injected,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::policies::constructible_impl<false,_boost::ext::di::v1_3_0::policies::is_injected<boost::ext::di::v1_3_0::_>_>_>_>_>
             *this)

{
  injector<must_be_injected,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::policies::constructible_impl<false,_boost::ext::di::v1_3_0::policies::is_injected<boost::ext::di::v1_3_0::_>_>_>_>_>
  *in_RDI;
  dependency__<boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_c,_c,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>
  *creatable_dept;
  dependency<boost::ext::di::v1_3_0::scopes::deduce,_c,_c,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
  *dependency;
  provider<boost::ext::di::v1_3_0::aux::pair<c,_boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::direct,_boost::ext::di::v1_3_0::aux::type_list<int,_d>_>_>,_boost::ext::di::v1_3_0::core::injector<must_be_injected,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::policies::constructible_impl<false,_boost::ext::di::v1_3_0::policies::is_injected<boost::ext::di::v1_3_0::_>_>_>_>_>_>
  *in_stack_ffffffffffffffb8;
  undefined1 local_11;
  undefined1 *local_10;
  
  binder::operator()(in_RDI);
  local_10 = &local_11;
  injector<must_be_injected,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::policies::constructible_impl<false,_boost::ext::di::v1_3_0::policies::is_injected<boost::ext::di::v1_3_0::_>_>_>_>_>
  ::cfg(in_RDI);
  must_be_injected::policies(in_RDI);
  policy::operator()((pool_t<boost::ext::di::v1_3_0::policies::constructible_impl<false,_boost::ext::di::v1_3_0::policies::is_injected<boost::ext::di::v1_3_0::_>_>_>
                      *)in_RDI);
  scopes::deduce::
  scope<$_11::TEMPNAMEPLACEHOLDERVALUE()const::c,$_11::TEMPNAMEPLACEHOLDERVALUE()const::c>::
  operator()((scope<c,_c> *)in_RDI,in_stack_ffffffffffffffb8);
  return;
}

Assistant:

auto create_successful_impl__() const {
    auto&& dependency = binder::resolve<T, TName>((injector*)this);
    using dependency_t = typename aux::remove_reference<decltype(dependency)>::type;
    using ctor_t = typename type_traits::ctor_traits__<binder::resolve_template_t<injector, typename dependency_t::given>, T,
                                                       typename dependency_t::ctor>::type;
    using provider_t = successful::provider<ctor_t, injector>;
    auto& creatable_dept = static_cast<dependency__<dependency_t>&>(dependency);
    using wrapper_t = decltype(creatable_dept.template create<T, TName>(provider_t{this}));
    using create_t = referable_t<T, config, dependency__<dependency_t>>;
    using ctor_args_t = typename ctor_t::second::second;
    policy::template call<arg_wrapper<T, TName, TIsRoot, ctor_args_t, dependency_t, pool_t>>(
        ((injector*)this)->cfg().policies(this));
    return successful::wrapper<create_t, wrapper_t>{creatable_dept.template create<T, TName>(provider_t{this})};
  }